

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O1

void __thiscall
UnexpectedExceptionFailure::UnexpectedExceptionFailure
          (UnexpectedExceptionFailure *this,UtestShell *test,exception *e)

{
  char *__ptr;
  undefined8 uVar1;
  char *pcVar2;
  SimpleString SStack_58;
  SimpleString local_48;
  int local_34;
  
  pcVar2 = *(char **)(*(long *)(*(long *)e + -8) + 8);
  pcVar2 = pcVar2 + (*pcVar2 == '*');
  local_34 = -1;
  __ptr = (char *)__cxa_demangle(pcVar2,0,0,&local_34);
  if (local_34 == 0) {
    pcVar2 = __ptr;
  }
  SimpleString::SimpleString(&SStack_58,pcVar2);
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  pcVar2 = SimpleString::asCharString(&SStack_58);
  uVar1 = (**(code **)(*(long *)e + 0x10))(e);
  StringFromFormat((char *)&local_48,"Unexpected exception of type \'%s\' was thrown: %s",pcVar2,
                   uVar1);
  TestFailure::TestFailure(&this->super_TestFailure,test,&local_48);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&SStack_58);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_003a7d50;
  return;
}

Assistant:

UnexpectedExceptionFailure::UnexpectedExceptionFailure(UtestShell* test, const std::exception &e)
: TestFailure(
    test,
#if CPPUTEST_HAVE_RTTI
    StringFromFormat(
        "Unexpected exception of type '%s' was thrown: %s",
        getExceptionTypeName(e).asCharString(),
        e.what()
    )
#else
    "Unexpected exception of unknown type was thrown."
#endif
)
{
    (void) e;
}